

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

size_t __thiscall proto2_unittest::TestParsingMergeLite::ByteSizeLong(TestParsingMergeLite *this)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  Rep *pRVar7;
  size_t sVar8;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *this_00;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *this_01;
  long lVar9;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *pRVar10;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *pRVar11;
  
  sVar6 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.repeated_all_types_;
  pRVar10 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar7 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    pRVar10 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar7->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar7 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                         (&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)pRVar7->elements;
    }
  }
  lVar9 = sVar6 + (long)iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar10 !=
         (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar10 = (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
                &(pRVar10->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = TestAllTypesLite::ByteSizeLong
                      ((TestAllTypesLite *)(pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_
                      );
    uVar4 = (uint)sVar6 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar9 = lVar9 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  this_01 = &(this->field_0)._impl_.repeatedgroup_;
  pRVar11 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x38) & 1) != 0) {
    pRVar7 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_01->super_RepeatedPtrFieldBase);
    pRVar11 = (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *)
              pRVar7->elements;
    if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar7 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                         (&this_01->super_RepeatedPtrFieldBase);
      this_01 = (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *)
                pRVar7->elements;
    }
  }
  sVar6 = lVar9 + (long)iVar1 * 4;
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  for (; pRVar11 !=
         (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *)
         (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar11 = (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *)
                &(pRVar11->super_RepeatedPtrFieldBase).current_size_) {
    sVar8 = TestParsingMergeLite_RepeatedGroup::ByteSizeLong
                      ((TestParsingMergeLite_RepeatedGroup *)
                       (pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    sVar6 = sVar6 + sVar8;
  }
  uVar4 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar4 & 1) != 0) {
    sVar8 = TestAllTypesLite::ByteSizeLong((this->field_0)._impl_.required_all_types_);
    uVar5 = (uint)sVar8 | 1;
    iVar1 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar6 = sVar6 + sVar8 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if ((uVar4 & 6) != 0) {
    if ((uVar4 & 2) != 0) {
      sVar8 = TestAllTypesLite::ByteSizeLong((this->field_0)._impl_.optional_all_types_);
      uVar5 = (uint)sVar8 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + sVar8 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 4) != 0) {
      sVar8 = TestParsingMergeLite_OptionalGroup::ByteSizeLong
                        ((this->field_0)._impl_.optionalgroup_);
      sVar6 = sVar6 + sVar8 + 2;
    }
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar6 = sVar6 + *(long *)((uVar2 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar6 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar6;
  }
  return sVar6;
}

Assistant:

::size_t TestParsingMergeLite::ByteSizeLong() const {
  const TestParsingMergeLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestParsingMergeLite)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.TestAllTypesLite repeated_all_types = 3;
    {
      total_size += 1UL * this_._internal_repeated_all_types_size();
      for (const auto& msg : this_._internal_repeated_all_types()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestParsingMergeLite.RepeatedGroup repeatedgroup = 20 [features = {
    {
      total_size += 4UL * this_._internal_repeatedgroup_size();
      for (const auto& msg : this_._internal_repeatedgroup()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
  }
   {
    // .proto2_unittest.TestAllTypesLite required_all_types = 1 [features = {
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_all_types_);
    }
  }
  if ((cached_has_bits & 0x00000006u) != 0) {
    // .proto2_unittest.TestAllTypesLite optional_all_types = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_all_types_);
    }
    // .proto2_unittest.TestParsingMergeLite.OptionalGroup optionalgroup = 10 [features = {
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}